

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O3

void test_array_insert(void)

{
  size_t index;
  int32_t iVar1;
  VALUE *pVVar2;
  size_t sVar3;
  VALUE a;
  VALUE VStack_38;
  
  value_init_array(&VStack_38);
  pVVar2 = value_array_append(&VStack_38);
  value_init_int32(pVVar2,-1);
  pVVar2 = value_array_append(&VStack_38);
  value_init_int32(pVVar2,100000);
  sVar3 = 0;
  do {
    index = sVar3 + 1;
    pVVar2 = value_array_insert(&VStack_38,index);
    value_init_int32(pVVar2,(int32_t)sVar3);
    sVar3 = index;
  } while (index != 100000);
  sVar3 = value_array_size(&VStack_38);
  acutest_check_((uint)(sVar3 == 0x186a2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2d5,"%s","value_array_size(&a) == N + 2");
  sVar3 = 0;
  do {
    pVVar2 = value_array_get(&VStack_38,sVar3);
    iVar1 = value_int32(pVVar2);
    acutest_check_((uint)((int)sVar3 + -1 == iVar1),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2d8,"%s","value_int32(v) == i - 1");
    sVar3 = sVar3 + 1;
  } while (sVar3 != 0x186a2);
  value_fini(&VStack_38);
  return;
}

Assistant:

static void
test_array_insert(void)
{
    const int N = 100000;

    VALUE a;
    VALUE* v;
    int i;

    value_init_array(&a);
    v = value_array_append(&a);
    value_init_int32(v, -1);
    v = value_array_append(&a);
    value_init_int32(v, N);
    for(i = 0; i < N; i++) {
        v = value_array_insert(&a, i + 1);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_array_size(&a) == N + 2);
    for(i = 0; i < N + 2; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i - 1);
    }
    value_fini(&a);
}